

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarPdr(Abc_Ntk_t *pNtk,Pdr_Par_t *pPars)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Man_t *pAig;
  abctime aVar5;
  char *format;
  int level;
  Abc_Ntk_t *pAVar6;
  Aig_Man_t *pAVar7;
  
  aVar4 = Abc_Clock();
  pAVar6 = pNtk;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    Abc_Print((int)pAVar6,"Converting network into AIG has failed.\n");
    return -1;
  }
  pAVar7 = pAig;
  iVar2 = Pdr_ManSolve(pAig,pPars);
  level = (int)pAVar7;
  pPars->nDropOuts = (pAig->nTruePos - pPars->nProveOuts) - pPars->nFailOuts;
  if (pPars->fSilent != 0) goto LAB_00231a21;
  if (pPars->fSolveAll == 0) {
    if (iVar2 == -1) {
      format = "Property UNDECIDED.  ";
    }
    else if (iVar2 == 0) {
      pAVar1 = pAig->pSeqModel;
      if (pAVar1 == (Abc_Cex_t *)0x0) {
        format = "Abc_NtkDarPdr(): Counter-example is not available.\n";
      }
      else {
        Abc_Print(level,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                  (ulong)(uint)pAVar1->iPo,pNtk->pName,(ulong)(uint)pAVar1->iFrame);
        pAVar7 = pAig;
        iVar3 = Saig_ManVerifyCex(pAig,pAig->pSeqModel);
        level = (int)pAVar7;
        if (iVar3 != 0) goto LAB_002319e9;
        format = "Abc_NtkDarPdr(): Counter-example verification has FAILED.\n";
      }
    }
    else {
      if (iVar2 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0xbbf,"int Abc_NtkDarPdr(Abc_Ntk_t *, Pdr_Par_t *)");
      }
      format = "Property proved.  ";
    }
    Abc_Print(level,format);
  }
  else {
    Abc_Print(level,"Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ");
  }
LAB_002319e9:
  Abc_Print(level,"%s =","Time");
  aVar5 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
LAB_00231a21:
  free(pNtk->pSeqModel);
  pNtk->pSeqModel = pAig->pSeqModel;
  pAig->pSeqModel = (Abc_Cex_t *)0x0;
  if (pNtk->vSeqModelVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(pNtk->vSeqModelVec);
  }
  pNtk->vSeqModelVec = pAig->vSeqModelVec;
  pAig->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Aig_ManStop(pAig);
  return iVar2;
}

Assistant:

int Abc_NtkDarPdr( Abc_Ntk_t * pNtk, Pdr_Par_t * pPars )
{
    int RetValue = -1;
    abctime clk = Abc_Clock();
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return -1;
    }
    RetValue = Pdr_ManSolve( pMan, pPars );
    pPars->nDropOuts = Saig_ManPoNum(pMan) - pPars->nProveOuts - pPars->nFailOuts;
    if ( !pPars->fSilent )
    {
        if ( pPars->fSolveAll )
            Abc_Print( 1, "Properties:  All = %d. Proved = %d. Disproved = %d. Undecided = %d.   ", 
                Saig_ManPoNum(pMan), pPars->nProveOuts, pPars->nFailOuts, pPars->nDropOuts );
        else if ( RetValue == 1 )
            Abc_Print( 1, "Property proved.  " );
        else 
        {
            if ( RetValue == 0 )
            {
                if ( pMan->pSeqModel == NULL )
                    Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example is not available.\n" );
                else
                {
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel->iPo, pNtk->pName, pMan->pSeqModel->iFrame );
                    if ( !Saig_ManVerifyCex( pMan, pMan->pSeqModel ) )
                        Abc_Print( 1, "Abc_NtkDarPdr(): Counter-example verification has FAILED.\n" );
                }
            }
            else if ( RetValue == -1 )
                Abc_Print( 1, "Property UNDECIDED.  " );
            else
                assert( 0 );
        }
        ABC_PRT( "Time", Abc_Clock() - clk );
/*
        Abc_Print( 1, "Status: " );
        if ( pPars->pOutMap )
        {
            int i;
            for ( i = 0; i < Saig_ManPoNum(pMan); i++ )
                if ( pPars->pOutMap[i] == 1 )
                    Abc_Print( 1, "%d=%s ", i, "unsat" );
                else if ( pPars->pOutMap[i] == 0 )
                    Abc_Print( 1, "%d=%s ", i, "sat" );
                else if ( pPars->pOutMap[i] < 0 )
                    Abc_Print( 1, "%d=%s ", i, "undec" );
                else assert( 0 );
        }
        Abc_Print( 1, "\n" );
*/
    }
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel;
    pMan->pSeqModel = NULL;
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    pNtk->vSeqModelVec = pMan->vSeqModelVec;
    pMan->vSeqModelVec = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}